

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bios.h
# Opt level: O0

int bios_u8(envy_bios *bios,uint offs,uint8_t *res)

{
  uint8_t *res_local;
  uint offs_local;
  envy_bios *bios_local;
  
  if (offs < bios->length) {
    *res = bios->data[offs];
    bios_local._4_4_ = 0;
  }
  else {
    *res = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)offs);
    bios_local._4_4_ = -0xe;
  }
  return bios_local._4_4_;
}

Assistant:

static inline int bios_u8(struct envy_bios *bios, unsigned int offs, uint8_t *res) {
	if (offs >= bios->length) {
		*res = 0;
		ENVY_BIOS_ERR("requested OOB u8 at 0x%04x\n", offs);
		return -EFAULT;
	}
	*res = bios->data[offs];
	return 0;
}